

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::handleSignal(int sig)

{
  IResultCapture *pIVar1;
  long lVar2;
  long lVar3;
  Context *pCVar4;
  size_t sVar5;
  char *__s;
  
  __s = "<unknown signal>";
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (lVar3 == 0x60) goto LAB_0013b1c2;
    lVar2 = lVar3 + 0x10;
  } while (*(int *)((long)&signalDefs + lVar3) != sig);
  __s = *(char **)((long)&PTR_anon_var_dwarf_1ced8e_001a44f8 + lVar3);
LAB_0013b1c2:
  restorePreviousSignalHandlers();
  pCVar4 = getCurrentContext();
  pIVar1 = pCVar4->m_resultCapture;
  sVar5 = strlen(__s);
  (*pIVar1->_vptr_IResultCapture[0xf])(pIVar1,__s,sVar5);
  raise(sig);
  return;
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }